

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_read(connectdata *conn,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  int iVar1;
  Curl_easy *pCVar2;
  _Bool _Var3;
  size_t __n;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  CURLcode result;
  CURLcode local_4c;
  char *local_48;
  size_t *local_40;
  undefined4 local_34;
  
  local_4c = CURLE_RECV_ERROR;
  pCVar2 = conn->data;
  sVar4 = sizerequested;
  local_48 = buf;
  local_40 = (size_t *)n;
  _Var3 = Curl_pipeline_wanted(pCVar2->multi,1);
  if (_Var3) {
    local_34 = (undefined4)CONCAT71((int7)(sVar4 >> 8),conn->bundle->multiuse == 1);
  }
  else {
    local_34 = 0;
  }
  iVar1 = conn->sock[1];
  *local_40 = 0;
  if ((char)local_34 == '\0') {
    uVar6 = (pCVar2->set).buffer_size;
    pcVar5 = local_48;
    if (uVar6 < sizerequested) {
      sizerequested = uVar6;
    }
  }
  else {
    uVar6 = conn->buf_len - conn->read_pos;
    if (sizerequested <= uVar6) {
      uVar6 = sizerequested;
    }
    if (uVar6 == 0) {
      sVar4 = 0x4000;
      if (sizerequested < 0x4000) {
        sVar4 = sizerequested;
      }
      pcVar5 = conn->master_buffer;
    }
    else {
      memcpy(local_48,conn->master_buffer + conn->read_pos,uVar6);
      conn->read_pos = conn->read_pos + uVar6;
      (conn->bits).stream_was_rewound = false;
      *local_40 = uVar6;
      pcVar5 = (char *)0x0;
      sVar4 = 0;
    }
    sizerequested = sVar4;
    if (uVar6 != 0) {
      return CURLE_OK;
    }
  }
  __n = (*conn->recv[iVar1 == sockfd])(conn,SUB14(iVar1 == sockfd,0),pcVar5,sizerequested,&local_4c)
  ;
  if (-1 < (long)__n) {
    if ((char)local_34 != '\0') {
      memcpy(local_48,conn->master_buffer,__n);
      conn->buf_len = __n;
      conn->read_pos = __n;
    }
    *local_40 = *local_40 + __n;
    local_4c = CURLE_OK;
  }
  return local_4c;
}

Assistant:

CURLcode Curl_read(struct connectdata *conn, /* connection data */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  struct Curl_easy *data = conn->data;

  /* if HTTP/1 pipelining is both wanted and possible */
  bool pipelining = Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
    (conn->bundle->multiuse == BUNDLE_PIPELINING);

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n=0; /* reset amount to zero */

  /* If session can pipeline, check connection buffer  */
  if(pipelining) {
    size_t bytestocopy = CURLMIN(conn->buf_len - conn->read_pos,
                                 sizerequested);

    /* Copy from our master buffer first if we have some unread data there*/
    if(bytestocopy > 0) {
      memcpy(buf, conn->master_buffer + conn->read_pos, bytestocopy);
      conn->read_pos += bytestocopy;
      conn->bits.stream_was_rewound = FALSE;

      *n = (ssize_t)bytestocopy;
      return CURLE_OK;
    }
    /* If we come here, it means that there is no data to read from the buffer,
     * so we read from the socket */
    bytesfromsocket = CURLMIN(sizerequested, MASTERBUF_SIZE);
    buffertofill = conn->master_buffer;
  }
  else {
    bytesfromsocket = CURLMIN(sizerequested, (size_t)data->set.buffer_size);
    buffertofill = buf;
  }

  nread = conn->recv[num](conn, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  if(pipelining) {
    memcpy(buf, conn->master_buffer, nread);
    conn->buf_len = nread;
    conn->read_pos = nread;
  }

  *n += nread;

  return CURLE_OK;
}